

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntFillExtra(Vec_Int_t *p,int nSize,int Fill)

{
  int iVar1;
  long lVar2;
  int nCapMin;
  
  if (p->nSize < nSize) {
    iVar1 = p->nCap * 2;
    nCapMin = nSize;
    if ((iVar1 < nSize) || (nCapMin = iVar1, p->nCap < nSize)) {
      Vec_IntGrow(p,nCapMin);
    }
    for (lVar2 = (long)p->nSize; lVar2 < nSize; lVar2 = lVar2 + 1) {
      p->pArray[lVar2] = 0;
    }
    p->nSize = nSize;
  }
  return;
}

Assistant:

static inline void Vec_IntFillExtra( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    if ( nSize <= p->nSize )
        return;
    if ( nSize > 2 * p->nCap )
        Vec_IntGrow( p, nSize );
    else if ( nSize > p->nCap )
        Vec_IntGrow( p, 2 * p->nCap );
    for ( i = p->nSize; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}